

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O3

size_t __thiscall
edition_unittest::TestCamelCaseFieldNames::ByteSizeLong(TestCamelCaseFieldNames *this)

{
  int iVar1;
  int iVar2;
  anon_union_192_1_493b367e_for_TestCamelCaseFieldNames_3 aVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar7;
  Rep *pRVar8;
  size_t sVar9;
  ulong uVar10;
  uint uVar11;
  int n;
  RepeatedPtrField<edition_unittest::ForeignMessage> *pRVar12;
  RepeatedPtrField<edition_unittest::ForeignMessage> *this_00;
  long lVar13;
  
  sVar6 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                    (&(this->field_0)._impl_.repeatedprimitivefield_,1,
                     &(this->field_0)._impl_._repeatedprimitivefield_cached_byte_size_);
  uVar5 = *(uint *)((long)&this->field_0 + 0x28);
  lVar13 = sVar6 + uVar5;
  if (0 < (int)uVar5) {
    uVar11 = 0;
    do {
      pVVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (&(this->field_0)._impl_.repeatedstringfield_.super_RepeatedPtrFieldBase,
                          uVar11);
      uVar4 = (uint)pVVar7->_M_string_length | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      lVar13 = lVar13 + pVVar7->_M_string_length + (ulong)(iVar1 * 9 + 0x49U >> 6);
      uVar11 = uVar11 + 1;
    } while (uVar5 != uVar11);
  }
  sVar6 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                    (&(this->field_0)._impl_.repeatedenumfield_,1,
                     &(this->field_0)._impl_._repeatedenumfield_cached_byte_size_);
  iVar1 = *(int *)((long)&this->field_0 + 0x58);
  this_00 = &(this->field_0)._impl_.repeatedmessagefield_;
  pRVar12 = this_00;
  if ((*(byte *)((long)&this->field_0 + 0x50) & 1) != 0) {
    pRVar8 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&this_00->super_RepeatedPtrFieldBase);
    pRVar12 = (RepeatedPtrField<edition_unittest::ForeignMessage> *)pRVar8->elements;
    if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar8 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                         (&this_00->super_RepeatedPtrFieldBase);
      this_00 = (RepeatedPtrField<edition_unittest::ForeignMessage> *)pRVar8->elements;
    }
  }
  lVar13 = (long)iVar1 + sVar6 + lVar13;
  iVar1 = *(int *)((long)&this->field_0 + 0x58);
  for (; pRVar12 !=
         (RepeatedPtrField<edition_unittest::ForeignMessage> *)
         (&(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar12 = (RepeatedPtrField<edition_unittest::ForeignMessage> *)
                &(pRVar12->super_RepeatedPtrFieldBase).current_size_) {
    sVar6 = ForeignMessage::ByteSizeLong
                      ((ForeignMessage *)(pRVar12->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar5 = (uint)sVar6 | 1;
    iVar2 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    lVar13 = lVar13 + sVar6 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  uVar5 = *(uint *)((long)&this->field_0 + 0x70);
  lVar13 = lVar13 + (ulong)uVar5;
  if (0 < (int)uVar5) {
    uVar11 = 0;
    do {
      pVVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (&(this->field_0)._impl_.repeatedstringpiecefield_.
                           super_RepeatedPtrFieldBase,uVar11);
      uVar4 = (uint)pVVar7->_M_string_length | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      lVar13 = lVar13 + pVVar7->_M_string_length + (ulong)(iVar1 * 9 + 0x49U >> 6);
      uVar11 = uVar11 + 1;
    } while (uVar5 != uVar11);
  }
  uVar5 = *(uint *)((long)&this->field_0 + 0x88);
  sVar6 = lVar13 + (ulong)uVar5;
  if (0 < (int)uVar5) {
    uVar11 = 0;
    do {
      pVVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                         (&(this->field_0)._impl_.repeatedcordfield_.super_RepeatedPtrFieldBase,
                          uVar11);
      uVar4 = (uint)pVVar7->_M_string_length | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar6 = sVar6 + pVVar7->_M_string_length + (ulong)(iVar1 * 9 + 0x49U >> 6);
      uVar11 = uVar11 + 1;
    } while (uVar5 != uVar11);
  }
  aVar3 = this->field_0;
  if (((undefined1  [192])aVar3 & (undefined1  [192])0x3f) != (undefined1  [192])0x0) {
    if (((undefined1  [192])aVar3 & (undefined1  [192])0x1) != (undefined1  [192])0x0) {
      lVar13 = *(long *)(((ulong)(this->field_0)._impl_.stringfield_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8);
      uVar5 = (uint)lVar13 | 1;
      iVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar6 = sVar6 + lVar13 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [192])aVar3 & (undefined1  [192])0x2) != (undefined1  [192])0x0) {
      lVar13 = *(long *)(((ulong)(this->field_0)._impl_.stringpiecefield_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8);
      uVar5 = (uint)lVar13 | 1;
      iVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar6 = sVar6 + lVar13 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [192])aVar3 & (undefined1  [192])0x4) != (undefined1  [192])0x0) {
      lVar13 = *(long *)(((ulong)(this->field_0)._impl_.cordfield_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8);
      uVar5 = (uint)lVar13 | 1;
      iVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar6 = sVar6 + lVar13 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [192])aVar3 & (undefined1  [192])0x8) != (undefined1  [192])0x0) {
      sVar9 = ForeignMessage::ByteSizeLong((this->field_0)._impl_.messagefield_);
      uVar5 = (uint)sVar9 | 1;
      iVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar6 = sVar6 + sVar9 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [192])aVar3 & (undefined1  [192])0x10) != (undefined1  [192])0x0) {
      uVar10 = (long)(this->field_0)._impl_.primitivefield_ | 1;
      lVar13 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      sVar6 = sVar6 + ((int)lVar13 * 9 + 0x89U >> 6);
    }
    if (((undefined1  [192])aVar3 & (undefined1  [192])0x20) != (undefined1  [192])0x0) {
      uVar10 = (long)(this->field_0)._impl_.enumfield_ | 1;
      lVar13 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      sVar6 = sVar6 + ((int)lVar13 * 9 + 0x49U >> 6) + 1;
    }
  }
  sVar6 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar6,&(this->field_0)._impl_._cached_size_);
  return sVar6;
}

Assistant:

::size_t TestCamelCaseFieldNames::ByteSizeLong() const {
  const TestCamelCaseFieldNames& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestCamelCaseFieldNames)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 RepeatedPrimitiveField = 7;
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_repeatedprimitivefield(), 1,
              this_._impl_._repeatedprimitivefield_cached_byte_size_);
    }
    // repeated string RepeatedStringField = 8;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_repeatedstringfield().size());
      for (int i = 0, n = this_._internal_repeatedstringfield().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeatedstringfield().Get(i));
      }
    }
    // repeated .edition_unittest.ForeignEnum RepeatedEnumField = 9;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeatedenumfield(), 1, this_._impl_._repeatedenumfield_cached_byte_size_);
    }
    // repeated .edition_unittest.ForeignMessage RepeatedMessageField = 10;
    {
      total_size += 1UL * this_._internal_repeatedmessagefield_size();
      for (const auto& msg : this_._internal_repeatedmessagefield()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated string RepeatedStringPieceField = 11 [ctype = STRING_PIECE];
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_repeatedstringpiecefield().size());
      for (int i = 0, n = this_._internal_repeatedstringpiecefield().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeatedstringpiecefield().Get(i));
      }
    }
    // repeated string RepeatedCordField = 12 [ctype = CORD];
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_repeatedcordfield().size());
      for (int i = 0, n = this_._internal_repeatedcordfield().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeatedcordfield().Get(i));
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    // string StringField = 2;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_stringfield());
    }
    // string StringPieceField = 5 [ctype = STRING_PIECE];
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_stringpiecefield());
    }
    // string CordField = 6 [ctype = CORD];
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_cordfield());
    }
    // .edition_unittest.ForeignMessage MessageField = 4;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.messagefield_);
    }
    // int32 PrimitiveField = 1;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_primitivefield());
    }
    // .edition_unittest.ForeignEnum EnumField = 3;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_enumfield());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}